

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O3

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)1>(SerialArena *this,size_t n)

{
  CachedBlock *pCVar1;
  bool bVar2;
  void *pvVar3;
  ulong uVar4;
  SerialArena *unaff_R14;
  void *ptr;
  atomic<char_*> local_20;
  
  if ((n & 7) == 0) {
    unaff_R14 = this;
    if ((this->ptr_)._M_b._M_p <= this->limit_) {
      if (0xf < n) {
        uVar4 = 0x3f;
        if (n - 1 != 0) {
          for (; n - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = (uVar4 ^ 0xffffffffffffffc0) + 0x3d;
        if (uVar4 < this->cached_block_length_) {
          pCVar1 = this->cached_blocks_[uVar4];
          if (pCVar1 != (CachedBlock *)0x0) {
            this->cached_blocks_[uVar4] = pCVar1->next;
            return pCVar1;
          }
        }
      }
      bVar2 = MaybeAllocateAligned(this,n,(void **)&stack0xffffffffffffffe0);
      if (bVar2) {
        return local_20._M_b._M_p._M_p;
      }
      goto LAB_00ec4c05;
    }
  }
  else {
    AllocateAligned<(google::protobuf::internal::AllocationClient)1>
              ((SerialArena *)&stack0xffffffffffffffe0);
  }
  AllocateAligned<(google::protobuf::internal::AllocationClient)1>();
LAB_00ec4c05:
  pvVar3 = AllocateAlignedFallback(unaff_R14,n);
  return pvVar3;
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }